

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setShortcut(QAction *this,QKeySequence *shortcut)

{
  bool bVar1;
  long in_FS_OFFSET;
  initializer_list<QKeySequence> args;
  QArrayDataPointer<QKeySequence> local_40;
  QKeySequence local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QKeySequence::isEmpty(shortcut);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setShortcuts(this,UnknownKey);
      return;
    }
  }
  else {
    QKeySequence::QKeySequence(&local_28,shortcut);
    args._M_len = 1;
    args._M_array = &local_28;
    QList<QKeySequence>::QList((QList<QKeySequence> *)&local_40,args);
    setShortcuts(this,(QList<QKeySequence> *)&local_40);
    QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_40);
    QKeySequence::~QKeySequence(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QAction::setShortcut(const QKeySequence &shortcut)
{
    if (shortcut.isEmpty())
        setShortcuts({});
    else
        setShortcuts({ shortcut });
}